

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<int,4,1,0,4,1>,Eigen::Map<Eigen::Matrix<int,4,1,0,4,1>const,0,Eigen::Stride<0,0>>,Eigen::internal::assign_op<int,int>>
               (Matrix<int,_4,_1,_0,_4,_1> *dst,
               Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *src,
               assign_op<int,_int> *func)

{
  undefined8 func_00;
  Matrix<int,_4,_1,_0,_4,_1> *dstExpr;
  undefined1 local_68 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<int,_int> *func_local;
  Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *src_local;
  Matrix<int,_4,_1,_0,_4,_1> *dst_local;
  
  srcEvaluator.
  super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
  ._8_8_ = func;
  evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  evaluator((evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)local_30,src);
  resize_if_allowed<Eigen::Matrix<int,4,1,0,4,1>,Eigen::Map<Eigen::Matrix<int,4,1,0,4,1>const,0,Eigen::Stride<0,0>>,int,int>
            (dst,src,(assign_op<int,_int> *)
                     srcEvaluator.
                     super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
                     ._8_8_);
  evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
            ._8_8_;
  dstExpr = EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
              *)local_68,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<int,_int> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<int,_int>,_0>,_2,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
         *)local_68);
  evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  ~evaluator((evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}